

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall
CVmConsole::log_event(CVmConsole *this,char *tag,char *param,size_t paramlen,int param_is_utf8)

{
  char cVar1;
  CCharmapToLocal *this_00;
  int iVar2;
  size_t sVar3;
  long lVar4;
  _func_int **pp_Var5;
  long lVar6;
  char *s2;
  CVmDataSource *pCVar7;
  char *__s;
  size_t sStack_50;
  size_t local_40;
  
  if (this->command_fp_ == (CVmDataSource *)0x0) {
    return;
  }
  sVar3 = strlen(tag);
  __s = tag + (*tag == '<');
  lVar4 = sVar3 - (*tag == '<');
  if (lVar4 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = lVar4 + -1;
    if (__s[lVar4 + -1] != '>') {
      lVar6 = lVar4;
    }
  }
  if ((this->field_0x18 & 4) == 0) {
    if (lVar6 != 4) {
      return;
    }
    iVar2 = memicmp(__s,"line",4);
    if (param == (char *)0x0) {
      return;
    }
    if (iVar2 != 0) {
      return;
    }
    CCharmapToLocal::write_file(G_cmap_to_ui_X,this->command_fp_,">",1);
    if (param_is_utf8 == 0) {
      pCVar7 = this->command_fp_;
      pp_Var5 = pCVar7->_vptr_CVmDataSource;
LAB_0023ab65:
      (*pp_Var5[4])(pCVar7,param,paramlen);
      goto LAB_0023ab68;
    }
    pCVar7 = this->command_fp_;
  }
  else {
    if (lVar6 == 0) {
      return;
    }
    local_40 = paramlen;
    if (lVar6 == 9) {
      s2 = "notimeout";
      sStack_50 = 9;
LAB_0023aacc:
      iVar2 = memicmp(__s,s2,sStack_50);
      if (iVar2 == 0) {
        param = (char *)0x0;
      }
    }
    else if (lVar6 == 3) {
      iVar2 = memicmp(__s,"key",3);
      if ((iVar2 == 0) && (paramlen == 1 && param != (char *)0x0)) {
        cVar1 = *param;
        if (cVar1 == '\t') {
          paramlen = 5;
          param = "[tab]";
        }
        else if (cVar1 == ' ') {
          paramlen = 7;
          param = "[space]";
        }
        else if (cVar1 == '\n') {
          paramlen = 7;
          param = "[enter]";
        }
        else {
          paramlen = 1;
        }
      }
      s2 = "eof";
      sStack_50 = 3;
      local_40 = paramlen;
      goto LAB_0023aacc;
    }
    CCharmapToLocal::write_file(G_cmap_to_ui_X,this->command_fp_,"<",1);
    this_00 = G_cmap_to_ui_X;
    pCVar7 = this->command_fp_;
    sVar3 = strlen(__s);
    CCharmapToLocal::write_file(this_00,pCVar7,__s,sVar3);
    CCharmapToLocal::write_file(G_cmap_to_ui_X,this->command_fp_,">",1);
    if (param == (char *)0x0) goto LAB_0023ab68;
    paramlen = local_40;
    if (param_is_utf8 == 0) {
      pCVar7 = this->command_fp_;
      pp_Var5 = pCVar7->_vptr_CVmDataSource;
      goto LAB_0023ab65;
    }
    pCVar7 = this->command_fp_;
  }
  CCharmapToLocal::write_file(G_cmap_to_ui_X,pCVar7,param,paramlen);
LAB_0023ab68:
  CCharmapToLocal::write_file(G_cmap_to_ui_X,this->command_fp_,"\n",1);
  (*this->command_fp_->_vptr_CVmDataSource[9])();
  return;
}

Assistant:

void CVmConsole::log_event(VMG_ const char *tag,
                           const char *param, size_t paramlen,
                           int param_is_utf8)
{
    /* if there's a script file, log the event */
    if (command_fp_ != 0)
    {
        /* if the tag has < > delimiters, remove them */
        size_t taglen = strlen(tag);
        if (tag[0] == '<')
            ++tag, --taglen;
        if (taglen != 0 && tag[taglen-1] == '>')
            --taglen;

        /* write the event in the proper format for the script type */
        if (command_eventscript_)
        {
            /* 
             *   It's an event script, so we write all event types.  Check
             *   for certain special parameter translations.  
             */
            if (taglen == 3 && memicmp(tag, "key", 3) == 0)
            {
                /* 
                 *   key event - for characters that would look like
                 *   whitespace characters if we wrote them as-is, translate
                 *   to [xxx] key names 
                 */
                if (param != 0 && paramlen == 1)
                {
                    switch (param[0])
                    {
                    case '\n':
                        param = "[enter]";
                        paramlen = 7;
                        break;

                    case '\t':
                        param = "[tab]";
                        paramlen = 5;
                        break;

                    case ' ':
                        param = "[space]";
                        paramlen = 7;
                        break;
                    }
                }
            }

            /* 
             *   if the event doesn't have parameters, ignore any parameter
             *   provided by the caller 
             */
            if ((taglen == 9 && memicmp(tag, "notimeout", 9) == 0)
                || (taglen == 3 && memicmp(tag, "eof", 3) == 0))
                param = 0;

            /* if we have a non-empty tag, write the event */
            if (taglen != 0)
            {
                /* write the tag, in the local character set */
                G_cmap_to_ui->write_file(command_fp_, "<", 1);
                G_cmap_to_ui->write_file(command_fp_, tag, strlen(tag));
                G_cmap_to_ui->write_file(command_fp_, ">", 1);
                
                /* add the parameter, if present */
                if (param != 0)
                {
                    if (param_is_utf8)
                        G_cmap_to_ui->write_file(command_fp_, param, paramlen);
                    else
                        command_fp_->write(param, paramlen);
                }
                
                /* add the newline */
                G_cmap_to_ui->write_file(command_fp_, "\n", 1);
                
                /* flush the output */
                command_fp_->flush();
            }
        }
        else
        {
            /*
             *   It's a plain old command-line script.  If the event is an
             *   input-line event, record it; otherwise leave it out, as this
             *   script file format can't represent any other event types.  
             */
            if (taglen == 4 && memicmp(tag, "line", 4) == 0 && param != 0)
            {
                /* write the ">" prefix */
                G_cmap_to_ui->write_file(command_fp_, ">", 1);

                /* add the command line */
                if (param_is_utf8)
                    G_cmap_to_ui->write_file(command_fp_, param, paramlen);
                else
                    command_fp_->write(param, paramlen);

                /* add the newline */
                G_cmap_to_ui->write_file(command_fp_, "\n", 1);

                /* flush the output */
                command_fp_->flush();
            }
        }
    }
}